

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

uint __thiscall
MovParsedSRTTrackData::newBufferSize(MovParsedSRTTrackData *this,uint8_t *buff,uint size)

{
  ushort uVar1;
  uint uVar2;
  int64_t iVar3;
  ushort *puVar4;
  uint uVar5;
  ushort *puVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ushort *puVar10;
  long lVar11;
  bool bVar12;
  string local_80;
  string prefix;
  int local_3c;
  int64_t local_38;
  int64_t iStack_30;
  
  local_38 = this->sttsPos;
  iStack_30 = this->sttsCnt;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::assign((char *)&prefix);
  }
  lVar7 = this->m_timeOffset;
  iVar3 = getSttsVal(this);
  lVar11 = iVar3 + lVar7;
  if (size < 3) {
    this->m_timeOffset = lVar11;
    uVar5 = 0;
  }
  else {
    local_3c = this->m_packetCnt + 1;
    int32ToStr_abi_cxx11_(&local_80,&local_3c);
    std::__cxx11::string::append((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((char *)&prefix);
    floatToTime_abi_cxx11_(&local_80,(double)lVar7 / 1000.0,',');
    std::__cxx11::string::append((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((char *)&prefix);
    floatToTime_abi_cxx11_(&local_80,(double)lVar11 / 1000.0,',');
    std::__cxx11::string::append((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::push_back((char)&prefix);
    puVar4 = (ushort *)(buff + size);
    uVar5 = 0;
    while (uVar5 == 0) {
      uVar1 = *(ushort *)buff;
      buff = (uint8_t *)((long)buff + 2);
      uVar5 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    }
    puVar10 = (ushort *)((long)buff + (ulong)uVar5);
    while (puVar10 < puVar4) {
      puVar6 = puVar10 + 4;
      lVar7 = ((ulong)(byte)puVar10[1] << 8 |
              (long)(int)((uint)(byte)*puVar10 << 0x18) |
              (ulong)*(byte *)((long)puVar10 + 1) << 0x10) + (ulong)*(byte *)((long)puVar10 + 3) +
              -8;
      if (lVar7 == 1) {
        uVar8 = 0;
        for (lVar7 = 0; (int)lVar7 != 8; lVar7 = lVar7 + 1) {
          uVar8 = uVar8 << 8 | (ulong)*(byte *)((long)puVar6 + lVar7);
        }
        puVar6 = puVar10 + 8;
        lVar7 = uVar8 - 8;
      }
      uVar9 = *(uint *)(puVar10 + 2);
      if ((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ==
          0x7374796c) {
        uVar8 = (ulong)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
        puVar10 = puVar6 + 1;
        while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
          if ((ushort)(*puVar10 << 8 | *puVar10 >> 8) < (ushort)(puVar10[1] << 8 | puVar10[1] >> 8))
          {
            uVar1 = puVar10[3];
            uVar9 = uVar5 + 7;
            if ((uVar1 & 1) == 0) {
              uVar9 = uVar5;
            }
            uVar2 = uVar9 + 7;
            if ((uVar1 & 2) == 0) {
              uVar2 = uVar9;
            }
            uVar5 = uVar2 + 7;
            if ((uVar1 & 4) == 0) {
              uVar5 = uVar2;
            }
          }
          puVar10 = puVar10 + 6;
        }
      }
      else {
        puVar10 = (ushort *)((long)puVar6 + lVar7);
      }
    }
    this->sttsPos = local_38;
    this->sttsCnt = iStack_30;
    uVar5 = uVar5 + (int)prefix._M_string_length + 2;
  }
  std::__cxx11::string::~string((string *)&prefix);
  return uVar5;
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const int64_t stored_sttsCnt = sttsCnt;
        const int64_t stored_sttsPos = sttsPos;
        const uint8_t* end = buff + size;
        std::string prefix;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        const int64_t startTime = m_timeOffset;
        const int64_t endTime = startTime + getSttsVal();
        if (size <= 2)
        {
            m_timeOffset = endTime;
            return 0;
        }
        prefix += int32ToStr(m_packetCnt + 1);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        int textLen = 0, unitSize = 0;

        try
        {
            while (unitSize == 0)
            {
                unitSize = (buff[0] << 8) | buff[1];
                buff += 2;
            }
            textLen = unitSize;
            buff += unitSize;

            while (buff < end)
            {
                int64_t modifierLen = buff[0] << 24 | buff[1] << 16 | buff[2] << 8 | buff[3];
                const uint32_t modifierType = buff[4] << 24 | buff[5] << 16 | buff[6] << 8 | buff[7];
                buff += 8;
                modifierLen -= 8;
                if (modifierLen == 1)  // 64-bit length
                {
                    modifierLen = 0;
                    for (int i = 0; i < 8; i++)
                    {
                        modifierLen <<= 8;
                        modifierLen |= *buff++;
                    }
                    modifierLen -= 8;
                }
                if (modifierType == 0x7374796C)  // 'styl' box
                {
                    const auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    buff += 2;
                    for (size_t i = 0; i < entry_count; i++)
                    {
                        const auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                        const auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                        buff += 6;                // startChar, endChar, font-ID
                        if (startChar < endChar)  // face style flags
                        {
                            if (*buff & 1)  // bold
                                textLen += 7;
                            if (*buff & 2)  // italics
                                textLen += 7;
                            if (*buff & 4)  // underline
                                textLen += 7;
                        }
                        buff += 6;  // font-size, text-color-rgba[4]
                    }
                }
                else
                    buff += modifierLen;
            }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            LTRACE(LT_ERROR, 2, "MP4/MOV error: Invalid SRT frame at position " << m_demuxer->getProcessedBytes());
        }

        sttsCnt = stored_sttsCnt;
        sttsPos = stored_sttsPos;
        return static_cast<int>(prefix.length() + textLen + 2);
    }